

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::scroll(QWidget *this,int dx,int dy)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar3;
  int *piVar4;
  int *piVar5;
  QRect *rect;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->data->widget_attributes;
  if (((((uVar1 >> 10 & 1) == 0) || (*(long *)(*(long *)&this->field_0x8 + 0x28) != 0)) &&
      (dy != 0 || dx != 0)) && ((uVar1 & 0x8000) != 0)) {
    this_00 = *(QWidgetPrivate **)&this->field_0x8;
    pQVar3 = this;
    do {
      lVar2 = *(long *)(*(long *)&pQVar3->field_0x8 + 0x78);
      if ((lVar2 != 0) &&
         (this_01 = *(QGraphicsProxyWidget **)(lVar2 + 0x10), this_01 != (QGraphicsProxyWidget *)0x0
         )) {
        piVar4 = (int *)QRegion::begin();
        piVar5 = (int *)QRegion::end();
        if (piVar4 != piVar5) {
          do {
            local_58.xp = (qreal)(*piVar4 + dx);
            local_58.yp = (qreal)(piVar4[1] + dy);
            local_58.w = (qreal)(((long)(piVar4[2] + dx) - (long)(*piVar4 + dx)) + 1);
            local_58.h = (qreal)(((long)(piVar4[3] + dy) - (long)(piVar4[1] + dy)) + 1);
            QGraphicsItem::update((QGraphicsItem *)(this_01 + 0x10),&local_58);
            piVar4 = piVar4 + 4;
          } while (piVar4 != piVar5);
        }
        QGraphicsProxyWidget::subWidgetRect(&local_58,this_01,this);
        QGraphicsItem::scroll((QGraphicsItem *)(this_01 + 0x10),(double)dx,(double)dy,&local_58);
        goto LAB_0030d2b4;
      }
      pQVar3 = *(QWidget **)(*(long *)&pQVar3->field_0x8 + 0x10);
    } while (pQVar3 != (QWidget *)0x0);
    QWidgetPrivate::setDirtyOpaqueRegion(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetPrivate::scroll_sys(this_00,dx,dy);
      return;
    }
  }
  else {
LAB_0030d2b4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::scroll(int dx, int dy)
{
    if ((!updatesEnabled() && children().size() == 0) || !isVisible())
        return;
    if (dx == 0 && dy == 0)
        return;
    Q_D(QWidget);
#if QT_CONFIG(graphicsview)
    if (QGraphicsProxyWidget *proxy = QWidgetPrivate::nearestGraphicsProxyWidget(this)) {
        // Graphics View maintains its own dirty region as a list of rects;
        // until we can connect item updates directly to the view, we must
        // separately add a translated dirty region.
        for (const QRect &rect : d->dirty)
            proxy->update(rect.translated(dx, dy));
        proxy->scroll(dx, dy, proxy->subWidgetRect(this));
        return;
    }
#endif
    d->setDirtyOpaqueRegion();
    d->scroll_sys(dx, dy);
}